

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataControllerDefault.cpp
# Opt level: O2

void __thiscall Rml::DataControllerEvent::ProcessEvent(DataControllerEvent *this)

{
  Event *in_RSI;
  
  ProcessEvent((DataControllerEvent *)&this[-1].id,in_RSI);
  return;
}

Assistant:

void DataControllerEvent::ProcessEvent(Event& event)
{
	if (!expression)
		return;

	if (Element* element = GetElement())
	{
		DataExpressionInterface expr_interface(element->GetDataModel(), element, &event);
		Variant unused_value_out;
		expression->Run(expr_interface, unused_value_out);
	}
}